

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O1

void base64_decode(char *in,char *out)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  unsigned_long blen;
  long local_28;
  
  sVar5 = strlen(in);
  iVar3 = (int)sVar5;
  pcVar6 = out;
  if (*in == '$') {
    pcVar6 = (char *)malloc((long)iVar3);
  }
  lVar7 = 0;
  if (iVar3 < 1) {
    lVar10 = 0;
  }
  else {
    uVar9 = 0;
    do {
      lVar10 = (long)(int)uVar9;
      if ((in[lVar10] == '$') && (uVar9 = lVar10 + 2U, in[lVar10 + 1] != '$')) {
        uVar11 = (long)(int)(lVar10 + 2U);
        do {
          uVar9 = uVar11;
          if (in[uVar11] == '\0') break;
          uVar9 = uVar11 + 1;
          pcVar1 = in + uVar11;
          uVar11 = uVar9;
        } while (*pcVar1 != '$');
      }
      iVar4 = (int)uVar9;
      pcVar6[lVar7] = ""[in[(long)iVar4 + 1]] >> 4 | ""[in[iVar4]] << 2;
      pcVar6[lVar7 + 1] = ""[in[(long)iVar4 + 2]] >> 2 | ""[in[(long)iVar4 + 1]] << 4;
      pcVar6[lVar7 + 2] = ""[in[(long)iVar4 + 2]] << 6 | ""[in[(long)iVar4 + 3]];
      lVar7 = lVar7 + 3;
      uVar8 = iVar4 + 4;
      uVar9 = (ulong)uVar8;
    } while ((int)uVar8 < iVar3);
    lVar10 = (long)(int)uVar8;
  }
  iVar3 = (int)lVar7;
  cVar2 = in[lVar10 + -2];
  if (((cVar2 == '=') || (cVar2 == '\0')) && ((in[lVar10 + -1] == '=' || (in[lVar10 + -1] == '\0')))
     ) {
    iVar3 = iVar3 + -1;
  }
  if (((cVar2 == '\0') || (in[lVar10 + -3] == '=')) && ((cVar2 == '=' || (in[lVar10 + -1] == '\0')))
     ) {
    iVar3 = iVar3 + -1;
  }
  pcVar6[iVar3] = '\0';
  if (*in == '$') {
    iVar4 = base64_strlen(in);
    local_28 = (long)iVar4;
    iVar3 = uncompress(out,&local_28,pcVar6,(long)iVar3);
    free(pcVar6);
    if (iVar3 != 0) {
      lVar7 = ftell((FILE *)loginfo.flog);
      if (iVar3 == -5) {
        pcVar6 = "Invalid size";
      }
      else if (iVar3 == -4) {
        pcVar6 = "Out of memory";
      }
      else {
        pcVar6 = "(unknown error)";
        if (iVar3 == -3) {
          pcVar6 = "Corrupted file";
        }
      }
      raw_printf("Decompressing save file failed at %ld: %s",lVar7,pcVar6);
      terminate();
    }
  }
  return;
}

Assistant:

static void base64_decode(const char *in, char *out)
{
    int i, len = strlen(in), pos = 0;
    char *o = out;

    if (*in == '$')
	o = malloc(len);

    for (i = 0; i < len; i += 4) {
	/* skip data between $ signs, it's the header for compressed data */
	if (in[i] == '$') {
	    for (i += 2; in[i-1] != '$' && in[i]; i++)
		/* empty */;
	}

	/* decode blocks; padding '=' are converted to 0 in the decoding table */
	o[pos  ] =   b64d[(int)in[i  ]] << 2          | b64d[(int)in[i+1]] >> 4;
	o[pos+1] =   b64d[(int)in[i+1]] << 4          | b64d[(int)in[i+2]] >> 2;
	o[pos+2] = ((b64d[(int)in[i+2]] << 6) & 0xc0) | b64d[(int)in[i+3]];
	pos += 3;
    }

    i -= 4;
    if ((in[i+2] == '=' || !in[i+2]) && (in[i+3] == '=' || !in[i+3])) pos--;
    if ((in[i+1] == '=' || !in[i+2]) && (in[i+2] == '=' || !in[i+3])) pos--;

    o[pos] = 0;

    if (*in == '$') {
	unsigned long blen = base64_strlen(in);
	int errcode = uncompress((unsigned char *)out, &blen,
				 (unsigned char *)o, pos);
	free(o);
	if (errcode != Z_OK) {
	    raw_printf("Decompressing save file failed at %ld: %s",
		       ftell(loginfo.flog),
		       errcode == Z_MEM_ERROR ? "Out of memory" :
		       errcode == Z_BUF_ERROR ? "Invalid size" :
		       errcode == Z_DATA_ERROR ? "Corrupted file" :
		       "(unknown error)");
	    terminate();
	}
    }
}